

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O0

int run_test_random_sync(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_208 [8];
  char buf [256];
  char zero [256];
  
  iVar1 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,local_208,0x100,0xffffffff,(uv_random_cb)0x0
                   );
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x52,"UV_EINVAL == uv_random(NULL, NULL, buf, sizeof(buf), -1, NULL)");
    abort();
  }
  iVar1 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,local_208,0xffffffffffffffff,0xffffffff,
                    (uv_random_cb)0x0);
  if (iVar1 != -7) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x53,"UV_E2BIG == uv_random(NULL, NULL, buf, -1, -1, NULL)");
    abort();
  }
  memset(local_208,0,0x100);
  iVar1 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,local_208,0x100,0,(uv_random_cb)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x56,"0 == uv_random(NULL, NULL, buf, sizeof(buf), 0, NULL)");
    abort();
  }
  memset(buf + 0xf8,0,0x100);
  iVar1 = memcmp(local_208,buf + 0xf8,0x100);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x5a,"0 != memcmp(buf, zero, sizeof(zero))");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
            ,0x5c,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(random_sync) {
  char zero[256];
  char buf[256];

  ASSERT(UV_EINVAL == uv_random(NULL, NULL, buf, sizeof(buf), -1, NULL));
  ASSERT(UV_E2BIG == uv_random(NULL, NULL, buf, -1, -1, NULL));

  memset(buf, 0, sizeof(buf));
  ASSERT(0 == uv_random(NULL, NULL, buf, sizeof(buf), 0, NULL));

  /* Buy a lottery ticket if you manage to trip this assertion. */
  memset(zero, 0, sizeof(zero));
  ASSERT(0 != memcmp(buf, zero, sizeof(zero)));

  MAKE_VALGRIND_HAPPY();
  return 0;
}